

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void Assimp::ExportSceneFBX
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  FBXExporter exporter;
  FBXExporter local_b0;
  
  local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0.binary = false;
  local_b0.outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b0.outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0.connections.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.connections.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.connections.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_b0.mesh_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_b0.material_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.material_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.material_uids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.node_uids._M_t._M_impl._0_8_ = 0;
  local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0.last_uid = 999999;
  local_b0.mScene = pScene;
  local_b0.mProperties = pProperties;
  local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0.node_uids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FBXExporter::ExportBinary(&local_b0,pFile,pIOSystem);
  FBXExporter::~FBXExporter(&local_b0);
  return;
}

Assistant:

void ExportSceneFBX (
        const char* pFile,
        IOSystem* pIOSystem,
        const aiScene* pScene,
        const ExportProperties* pProperties
    ){
        // initialize the exporter
        FBXExporter exporter(pScene, pProperties);

        // perform binary export
        exporter.ExportBinary(pFile, pIOSystem);
    }